

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_read(Curl_easy *data)

{
  smb_request *psVar1;
  CURLcode CVar2;
  undefined1 local_3b;
  undefined1 local_3a;
  unsigned_short local_36;
  undefined1 uStack_34;
  smb_read msg;
  curl_off_t offset;
  smb_request *req;
  Curl_easy *data_local;
  
  psVar1 = (data->req).p.smb;
  msg._19_8_ = (data->req).offset;
  memset(&local_3b,0,0x1b);
  local_3b = 0xc;
  local_3a = 0xff;
  local_36 = psVar1->fid;
  _uStack_34 = msg._19_4_;
  msg._13_4_ = msg._23_4_;
  msg.fid = 0x8000;
  msg.andx.offset = 0x8000;
  CVar2 = smb_send_message(data,'.',&local_3b,0x1b);
  return CVar2;
}

Assistant:

static CURLcode smb_send_read(struct Curl_easy *data)
{
  struct smb_request *req = data->req.p.smb;
  curl_off_t offset = data->req.offset;
  struct smb_read msg;

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_READ_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.fid = smb_swap16(req->fid);
  msg.offset = smb_swap32((unsigned int) offset);
  msg.offset_high = smb_swap32((unsigned int) (offset >> 32));
  msg.min_bytes = smb_swap16(MAX_PAYLOAD_SIZE);
  msg.max_bytes = smb_swap16(MAX_PAYLOAD_SIZE);

  return smb_send_message(data, SMB_COM_READ_ANDX, &msg, sizeof(msg));
}